

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_safe_queue.h
# Opt level: O2

size_t __thiscall cppnet::ThreadSafeQueue<cppnet::Log_*>::Size(ThreadSafeQueue<cppnet::Log_*> *this)

{
  size_type sVar1;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_20;
  
  std::unique_lock<std::mutex>::unique_lock(&local_20,&this->_mutex);
  sVar1 = std::deque<cppnet::Log_*,_std::allocator<cppnet::Log_*>_>::size(&(this->_queue).c);
  std::unique_lock<std::mutex>::~unique_lock(&local_20);
  return sVar1;
}

Assistant:

size_t Size() {
        std::unique_lock<std::mutex> lock(_mutex);
        return _queue.size();
    }